

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetFullNameInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *outPrefix,
          string *outBase,string *outSuffix)

{
  cmMakefile *pcVar1;
  TargetType TVar2;
  string *psVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  char *local_260;
  bool local_23d;
  char *local_228;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  char *local_150;
  char *soversion;
  string local_128;
  string local_108;
  string local_e8 [8];
  string fw_prefix;
  string configPostfix;
  char *targetSuffix;
  char *targetPrefix;
  string ll;
  allocator<char> local_61;
  string local_60;
  byte local_39;
  string *psStack_38;
  bool isImportedLibraryArtifact;
  string *outSuffix_local;
  string *outBase_local;
  string *outPrefix_local;
  string *psStack_18;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  psStack_38 = outSuffix;
  outSuffix_local = outBase;
  outBase_local = outPrefix;
  outPrefix_local._4_4_ = artifact;
  psStack_18 = config;
  config_local = (string *)this;
  TVar2 = GetType(this);
  if ((((TVar2 == STATIC_LIBRARY) || (TVar2 = GetType(this), TVar2 == SHARED_LIBRARY)) ||
      (TVar2 = GetType(this), TVar2 == MODULE_LIBRARY)) ||
     (TVar2 = GetType(this), TVar2 == EXECUTABLE)) {
    bVar5 = outPrefix_local._4_4_ == ImportLibraryArtifact;
    ll.field_2._M_local_buf[0xb] = '\0';
    bVar6 = false;
    local_39 = bVar5;
    if (bVar5) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_61);
      ll.field_2._M_local_buf[0xb] = '\x01';
      pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_60);
      bVar6 = pcVar4 == (char *)0x0;
    }
    if ((ll.field_2._M_local_buf[0xb] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_60);
    }
    if (bVar5) {
      std::allocator<char>::~allocator(&local_61);
    }
    if (bVar6) {
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
    }
    else {
      GetLinkerLanguage((string *)&targetPrefix,this,psStack_18);
      targetSuffix = GetFilePrefixInternal(this,outPrefix_local._4_4_,(string *)&targetPrefix);
      configPostfix.field_2._8_8_ =
           GetFileSuffixInternal(this,outPrefix_local._4_4_,(string *)&targetPrefix);
      TVar2 = GetType(this);
      if (((TVar2 != SHARED_LIBRARY) && (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) &&
         (TVar2 = GetType(this), TVar2 != EXECUTABLE)) {
        outPrefix_local._4_4_ = RuntimeBinaryArtifact;
      }
      GetFilePostfix((string *)((long)&fw_prefix.field_2 + 8),this,psStack_18);
      std::__cxx11::string::string(local_e8);
      bVar6 = IsFrameworkOnApple(this);
      if (bVar6) {
        GetFrameworkDirectory(&local_108,this,psStack_18,ContentLevel);
        std::__cxx11::string::operator=(local_e8,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::operator+=(local_e8,"/");
        targetSuffix = (char *)std::__cxx11::string::c_str();
        configPostfix.field_2._8_8_ = 0;
      }
      bVar6 = IsCFBundleOnApple(this);
      if (bVar6) {
        GetCFBundleDirectory(&local_128,this,psStack_18,FullLevel);
        std::__cxx11::string::operator=(local_e8,(string *)&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::operator+=(local_e8,"/");
        targetSuffix = (char *)std::__cxx11::string::c_str();
        configPostfix.field_2._8_8_ = 0;
      }
      if (targetSuffix == (char *)0x0) {
        local_228 = "";
      }
      else {
        local_228 = targetSuffix;
      }
      std::__cxx11::string::operator=((string *)outBase_local,local_228);
      GetOutputName((string *)&soversion,this,psStack_18,outPrefix_local._4_4_);
      std::__cxx11::string::operator+=((string *)outSuffix_local,(string *)&soversion);
      std::__cxx11::string::~string((string *)&soversion);
      std::__cxx11::string::operator+=
                ((string *)outSuffix_local,(string *)(fw_prefix.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"SOVERSION",&local_171);
      pcVar4 = GetProperty(this,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      local_150 = pcVar4;
      if (pcVar4 != (char *)0x0) {
        bVar5 = false;
        bVar6 = false;
        TVar2 = GetType(this);
        local_23d = false;
        if ((TVar2 == SHARED_LIBRARY) && (local_23d = false, (local_39 & 1) == 0)) {
          pcVar1 = this->Makefile;
          std::allocator<char>::allocator();
          bVar5 = true;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_198,"CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION",&local_199);
          bVar6 = true;
          local_23d = cmMakefile::IsOn(pcVar1,&local_198);
        }
        if (bVar6) {
          std::__cxx11::string::~string((string *)&local_198);
        }
        if (bVar5) {
          std::allocator<char>::~allocator(&local_199);
        }
        if (local_23d != false) {
          std::__cxx11::string::operator+=((string *)outSuffix_local,"-");
          std::__cxx11::string::operator+=((string *)outSuffix_local,local_150);
        }
      }
      if (configPostfix.field_2._8_8_ == 0) {
        local_260 = "";
      }
      else {
        local_260 = (char *)configPostfix.field_2._8_8_;
      }
      std::__cxx11::string::operator=((string *)psStack_38,local_260);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string((string *)(fw_prefix.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&targetPrefix);
    }
  }
  else {
    std::__cxx11::string::clear();
    psVar3 = GetName_abi_cxx11_(this);
    std::__cxx11::string::operator=((string *)outSuffix_local,(string *)psVar3);
    std::__cxx11::string::clear();
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetFullNameInternal(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  std::string& outPrefix, std::string& outBase, std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    outPrefix.clear();
    outBase = this->GetName();
    outSuffix.clear();
    return;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    outPrefix.clear();
    outBase.clear();
    outSuffix.clear();
    return;
  }

  // retrieve prefix and suffix
  std::string ll = this->GetLinkerLanguage(config);
  const char* targetPrefix = this->GetFilePrefixInternal(artifact, ll);
  const char* targetSuffix = this->GetFileSuffixInternal(artifact, ll);

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute the full name for main target types.
  const std::string configPostfix = this->GetFilePostfix(config);

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if (this->IsFrameworkOnApple()) {
    fw_prefix = this->GetFrameworkDirectory(config, ContentLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  if (this->IsCFBundleOnApple()) {
    fw_prefix = this->GetCFBundleDirectory(config, FullLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix ? targetPrefix : "";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, artifact);

  // Append the per-configuration postfix.
  outBase += configPostfix;

  // Name shared libraries with their version number on some platforms.
  if (const char* soversion = this->GetProperty("SOVERSION")) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY &&
        !isImportedLibraryArtifact &&
        this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION")) {
      outBase += "-";
      outBase += soversion;
    }
  }

  // Append the suffix.
  outSuffix = targetSuffix ? targetSuffix : "";
}